

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

MODIFIED_HANDLE modified_clone(MODIFIED_HANDLE value)

{
  MODIFIED_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (MODIFIED_HANDLE)malloc(8);
  if (__ptr != (MODIFIED_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (MODIFIED_HANDLE)0x0;
}

Assistant:

MODIFIED_HANDLE modified_clone(MODIFIED_HANDLE value)
{
    MODIFIED_INSTANCE* modified_instance = (MODIFIED_INSTANCE*)malloc(sizeof(MODIFIED_INSTANCE));
    if (modified_instance != NULL)
    {
        modified_instance->composite_value = amqpvalue_clone(((MODIFIED_INSTANCE*)value)->composite_value);
        if (modified_instance->composite_value == NULL)
        {
            free(modified_instance);
            modified_instance = NULL;
        }
    }

    return modified_instance;
}